

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

_Bool apx_util_verify_name(char *pBegin,char *pEnd)

{
  char cVar1;
  bool bVar2;
  ushort **ppuVar3;
  int local_34;
  char *pcStack_30;
  int c;
  char *pNext;
  _Bool first;
  char *pEnd_local;
  char *pBegin_local;
  
  bVar2 = true;
  if (((pBegin == (char *)0x0) || (pEnd == (char *)0x0)) || (pEnd < pBegin)) {
    __assert_fail("(pBegin != 0) && (pEnd != 0) && (pBegin <= pEnd)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/util.c"
                  ,0x122,"_Bool apx_util_verify_name(const char *, const char *)");
  }
  if (pBegin != pEnd) {
    cVar1 = *pBegin;
    for (pcStack_30 = pBegin; local_34 = (int)cVar1, pcStack_30 < pEnd; pcStack_30 = pcStack_30 + 1)
    {
      if (bVar2) {
        bVar2 = false;
        if ((((local_34 != 0x2e) && (local_34 != 0x5f)) && (local_34 != 0x2d)) &&
           ((local_34 != 0x7e && (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[local_34] & 0x400) == 0))))
        {
          return false;
        }
      }
      else if (((local_34 != 0x2e) && (local_34 != 0x5f)) &&
              ((local_34 != 0x2d &&
               ((local_34 != 0x7e && (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[local_34] & 8) == 0))))
              )) {
        return false;
      }
      cVar1 = pcStack_30[1];
    }
  }
  return true;
}

Assistant:

static bool apx_util_verify_name(const char *pBegin, const char *pEnd)
{
   bool first = true;
   const char *pNext = pBegin;
   int c;
   assert((pBegin != 0) && (pEnd != 0) && (pBegin <= pEnd));
   if (pBegin==pEnd)
   {
      //empty string
      return true;
   }
   for(c=*pNext; pNext<pEnd; c=*(++pNext))
   {
      if (first)
      {
         first = false;
         if ( (c != '.') && (c != '_') && (c != '-') && (c!= '~') && !isalpha(c))
         {
            return false;
         }
      }
      else
      {
         if ( (c != '.') && (c != '_') && (c != '-') && (c!= '~') && !isalnum(c))
         {
            return false;
         }
      }
   }
   return true;
}